

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_avx512_harvey_seal(uint16_t *data,uint32_t len,uint32_t *flags)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint32_t uVar6;
  long lVar7;
  undefined1 (*pauVar8) [64];
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar38 [64];
  undefined1 auStack_4c0 [64];
  undefined1 auStack_480 [64];
  undefined1 auStack_440 [64];
  undefined1 auStack_400 [64];
  undefined1 auStack_3c0 [64];
  undefined1 auStack_380 [64];
  undefined1 auStack_340 [64];
  undefined1 auStack_300 [64];
  undefined1 auStack_2c0 [64];
  undefined1 auStack_280 [64];
  undefined1 auStack_240 [64];
  undefined1 auStack_200 [64];
  undefined1 auStack_1c0 [64];
  undefined1 auStack_180 [64];
  undefined1 auStack_140 [64];
  undefined1 auStack_100 [64];
  undefined1 auStack_c0 [64];
  
  for (uVar2 = len & 0xfffffe00; uVar2 < len; uVar2 = uVar2 + 1) {
    uVar1 = data[uVar2];
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      flags[lVar7] = flags[lVar7] + (uint)((uVar1 >> ((uint)lVar7 & 0x1f) & 1) != 0);
    }
  }
  auVar11 = vpbroadcastw_avx512bw(ZEXT216(1));
  auVar10 = vpxord_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
  auVar38 = ZEXT1664(auVar10);
  auVar37 = ZEXT1664((undefined1  [16])0x0);
  auVar35 = ZEXT1664((undefined1  [16])0x0);
  auVar34 = ZEXT1664((undefined1  [16])0x0);
  auVar36 = ZEXT1664((undefined1  [16])0x0);
  uVar3 = 0;
  uVar5 = (ulong)(len >> 5 & 0xfffffff0);
  while (uVar3 < uVar5) {
    for (lVar7 = 0; lVar7 != 0x400; lVar7 = lVar7 + 0x40) {
      *(undefined8 *)(auStack_480 + lVar7) = 0;
      *(undefined8 *)(auStack_480 + lVar7 + 8) = 0;
      *(undefined8 *)(auStack_480 + lVar7 + 0x10) = 0;
      *(undefined8 *)(auStack_480 + lVar7 + 0x18) = 0;
      *(undefined8 *)(auStack_480 + lVar7 + 0x20) = 0;
      *(undefined8 *)(auStack_480 + lVar7 + 0x28) = 0;
      *(undefined8 *)(auStack_480 + lVar7 + 0x30) = 0;
      *(undefined8 *)(auStack_480 + lVar7 + 0x38) = 0;
    }
    auVar12 = vmovdqa64_avx512f(auStack_480);
    auVar13 = vmovdqa64_avx512f(auStack_440);
    auVar14 = vmovdqa64_avx512f(auStack_400);
    auVar15 = vmovdqa64_avx512f(auStack_3c0);
    auVar16 = vmovdqa64_avx512f(auStack_380);
    auVar17 = vmovdqa64_avx512f(auStack_340);
    auVar18 = vmovdqa64_avx512f(auStack_300);
    auVar19 = vmovdqa64_avx512f(auStack_2c0);
    auVar20 = vmovdqa64_avx512f(auStack_280);
    auVar21 = vmovdqa64_avx512f(auStack_240);
    auVar22 = vmovdqa64_avx512f(auStack_200);
    auVar23 = vmovdqa64_avx512f(auStack_1c0);
    auVar24 = vmovdqa64_avx512f(auStack_180);
    auVar25 = vmovdqa64_avx512f(auStack_140);
    auVar26 = vmovdqa64_avx512f(auStack_100);
    auVar27 = vmovdqa64_avx512f(auStack_c0);
    uVar4 = uVar3 + 0xffff;
    if (uVar5 - uVar3 < 0x10000) {
      uVar4 = uVar5;
    }
    pauVar8 = (undefined1 (*) [64])(data + uVar3 * 0x20 + 0x1e0);
    while (uVar3 < uVar4) {
      auVar28 = vmovdqu64_avx512f(pauVar8[-0xe]);
      auVar29 = vmovdqu64_avx512f(pauVar8[-0xf]);
      auVar30 = vmovdqu64_avx512f(pauVar8[-0xd]);
      auVar31 = vmovdqu64_avx512f(pauVar8[-0xc]);
      auVar32 = vmovdqu64_avx512f(pauVar8[-8]);
      uVar3 = uVar3 + 0x10;
      auVar33 = vmovdqa64_avx512f(auVar28);
      auVar28 = vpternlogd_avx512f(auVar28,auVar29,auVar38,0x96);
      auVar38 = vpternlogd_avx512f(auVar33,auVar29,auVar38,0xe8);
      auVar29 = vmovdqa64_avx512f(auVar31);
      auVar29 = vpternlogd_avx512f(auVar29,auVar30,auVar28,0xe8);
      auVar28 = vpternlogd_avx512f(auVar28,auVar30,auVar31,0x96);
      auVar30 = vmovdqu64_avx512f(pauVar8[-10]);
      auVar31 = vmovdqa64_avx512f(auVar29);
      auVar31 = vpternlogd_avx512f(auVar31,auVar38,auVar37,0xe8);
      auVar37 = vpternlogd_avx512f(auVar29,auVar38,auVar37,0x96);
      auVar38 = vmovdqu64_avx512f(pauVar8[-0xb]);
      auVar29 = vmovdqa64_avx512f(auVar32);
      auVar33 = vmovdqa64_avx512f(auVar30);
      auVar33 = vpternlogd_avx512f(auVar33,auVar38,auVar28,0xe8);
      auVar38 = vpternlogd_avx512f(auVar28,auVar38,auVar30,0x96);
      auVar28 = vmovdqu64_avx512f(pauVar8[-9]);
      auVar29 = vpternlogd_avx512f(auVar29,auVar28,auVar38,0xe8);
      auVar38 = vpternlogd_avx512f(auVar38,auVar28,auVar32,0x96);
      auVar28 = vmovdqu64_avx512f(pauVar8[-6]);
      auVar30 = vmovdqa64_avx512f(auVar29);
      auVar30 = vpternlogd_avx512f(auVar30,auVar33,auVar37,0xe8);
      auVar37 = vpternlogd_avx512f(auVar29,auVar33,auVar37,0x96);
      auVar29 = vmovdqa64_avx512f(auVar30);
      auVar29 = vpternlogd_avx512f(auVar29,auVar31,auVar35,0xe8);
      auVar35 = vpternlogd_avx512f(auVar30,auVar31,auVar35,0x96);
      auVar30 = vmovdqu64_avx512f(pauVar8[-7]);
      auVar31 = vmovdqa64_avx512f(auVar28);
      auVar31 = vpternlogd_avx512f(auVar31,auVar30,auVar38,0xe8);
      auVar38 = vpternlogd_avx512f(auVar38,auVar30,auVar28,0x96);
      auVar28 = vmovdqu64_avx512f(pauVar8[-4]);
      auVar30 = vmovdqu64_avx512f(pauVar8[-5]);
      auVar32 = vmovdqa64_avx512f(auVar28);
      auVar32 = vpternlogd_avx512f(auVar32,auVar30,auVar38,0xe8);
      auVar38 = vpternlogd_avx512f(auVar38,auVar30,auVar28,0x96);
      auVar28 = vmovdqu64_avx512f(pauVar8[-3]);
      auVar30 = vmovdqu64_avx512f(pauVar8[-2]);
      auVar33 = vmovdqa64_avx512f(auVar32);
      auVar33 = vpternlogd_avx512f(auVar33,auVar31,auVar37,0xe8);
      auVar37 = vpternlogd_avx512f(auVar32,auVar31,auVar37,0x96);
      auVar31 = vmovdqu64_avx512f(*pauVar8);
      auVar32 = vmovdqa64_avx512f(auVar30);
      auVar32 = vpternlogd_avx512f(auVar32,auVar28,auVar38,0xe8);
      auVar38 = vpternlogd_avx512f(auVar38,auVar28,auVar30,0x96);
      auVar28 = vmovdqu64_avx512f(pauVar8[-1]);
      pauVar8 = pauVar8 + 0x10;
      auVar30 = vmovdqa64_avx512f(auVar31);
      auVar30 = vpternlogd_avx512f(auVar30,auVar28,auVar38,0xe8);
      auVar38 = vpternlogd_avx512f(auVar38,auVar28,auVar31,0x96);
      auVar28 = vpsrlw_avx512bw(auVar36,1);
      auVar31 = vmovdqa64_avx512f(auVar30);
      auVar31 = vpternlogd_avx512f(auVar31,auVar32,auVar37,0xe8);
      auVar37 = vpternlogd_avx512f(auVar30,auVar32,auVar37,0x96);
      auVar30 = vpandq_avx512f(auVar36,auVar11);
      auVar32 = vmovdqa64_avx512f(auVar31);
      auVar12 = vpaddw_avx512bw(auVar12,auVar30);
      auVar30 = vpternlogd_avx512f(auVar32,auVar33,auVar35,0xe8);
      auVar35 = vpternlogd_avx512f(auVar31,auVar33,auVar35,0x96);
      auVar28 = vpandq_avx512f(auVar28,auVar11);
      auVar31 = vpsrlw_avx512bw(auVar36,2);
      auVar32 = vpsrlw_avx512bw(auVar36,3);
      auVar13 = vpaddw_avx512bw(auVar13,auVar28);
      auVar28 = vpandq_avx512f(auVar31,auVar11);
      auVar31 = vpsrlw_avx512bw(auVar36,4);
      auVar14 = vpaddw_avx512bw(auVar14,auVar28);
      auVar28 = vpandq_avx512f(auVar32,auVar11);
      auVar32 = vpsrlw_avx512bw(auVar36,5);
      auVar15 = vpaddw_avx512bw(auVar15,auVar28);
      auVar28 = vpandq_avx512f(auVar31,auVar11);
      auVar31 = vpsrlw_avx512bw(auVar36,6);
      auVar16 = vpaddw_avx512bw(auVar16,auVar28);
      auVar28 = vpandq_avx512f(auVar32,auVar11);
      auVar32 = vpsrlw_avx512bw(auVar36,7);
      auVar17 = vpaddw_avx512bw(auVar17,auVar28);
      auVar28 = vpandq_avx512f(auVar31,auVar11);
      auVar31 = vpsrlw_avx512bw(auVar36,8);
      auVar18 = vpaddw_avx512bw(auVar18,auVar28);
      auVar28 = vpandq_avx512f(auVar32,auVar11);
      auVar32 = vpsrlw_avx512bw(auVar36,9);
      auVar19 = vpaddw_avx512bw(auVar19,auVar28);
      auVar28 = vpandq_avx512f(auVar31,auVar11);
      auVar31 = vpsrlw_avx512bw(auVar36,10);
      auVar20 = vpaddw_avx512bw(auVar20,auVar28);
      auVar28 = vpandq_avx512f(auVar32,auVar11);
      auVar32 = vpsrlw_avx512bw(auVar36,0xb);
      auVar21 = vpaddw_avx512bw(auVar21,auVar28);
      auVar28 = vpandq_avx512f(auVar31,auVar11);
      auVar31 = vpsrlw_avx512bw(auVar36,0xc);
      auVar22 = vpaddw_avx512bw(auVar22,auVar28);
      auVar28 = vpandq_avx512f(auVar32,auVar11);
      auVar32 = vpsrlw_avx512bw(auVar36,0xd);
      auVar23 = vpaddw_avx512bw(auVar23,auVar28);
      auVar28 = vpandq_avx512f(auVar31,auVar11);
      auVar31 = vpsrlw_avx512bw(auVar36,0xe);
      auVar36 = vpsrlw_avx512bw(auVar36,0xf);
      auVar24 = vpaddw_avx512bw(auVar24,auVar28);
      auVar28 = vpandq_avx512f(auVar32,auVar11);
      auVar27 = vpaddw_avx512bw(auVar27,auVar36);
      auVar36 = vmovdqa64_avx512f(auVar30);
      auVar36 = vpternlogd_avx512f(auVar36,auVar29,auVar34,0xe8);
      auVar34 = vpternlogd_avx512f(auVar34,auVar29,auVar30,0x96);
      auVar38 = vmovdqa64_avx512f(auVar38);
      auVar25 = vpaddw_avx512bw(auVar25,auVar28);
      auVar28 = vpandq_avx512f(auVar31,auVar11);
      auVar26 = vpaddw_avx512bw(auVar26,auVar28);
    }
    auStack_440 = vmovdqa64_avx512f(auVar13);
    auStack_400 = vmovdqa64_avx512f(auVar14);
    auStack_3c0 = vmovdqa64_avx512f(auVar15);
    auStack_380 = vmovdqa64_avx512f(auVar16);
    auStack_340 = vmovdqa64_avx512f(auVar17);
    auStack_300 = vmovdqa64_avx512f(auVar18);
    auStack_2c0 = vmovdqa64_avx512f(auVar19);
    auStack_280 = vmovdqa64_avx512f(auVar20);
    auStack_240 = vmovdqa64_avx512f(auVar21);
    auStack_200 = vmovdqa64_avx512f(auVar22);
    auStack_1c0 = vmovdqa64_avx512f(auVar23);
    auStack_180 = vmovdqa64_avx512f(auVar24);
    auStack_140 = vmovdqa64_avx512f(auVar25);
    auStack_100 = vmovdqa64_avx512f(auVar26);
    auStack_c0 = vmovdqa64_avx512f(auVar27);
    lVar7 = 0;
    auStack_480 = vmovdqa64_avx512f(auVar12);
    for (; lVar7 != 0x400; lVar7 = lVar7 + 0x40) {
      auVar12 = vpandq_avx512f(auVar36,auVar11);
      auVar12 = vpaddw_avx512bw(auVar12,*(undefined1 (*) [64])(auStack_480 + lVar7));
      auVar36 = vpsrlw_avx512bw(auVar36,1);
      auVar12 = vmovdqa64_avx512f(auVar12);
      *(undefined1 (*) [64])(auStack_480 + lVar7) = auVar12;
    }
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      lVar9 = 0;
      auVar12 = vmovdqa64_avx512f(*(undefined1 (*) [64])(auStack_480 + lVar7 * 0x40));
      auStack_4c0 = vmovdqu64_avx512f(auVar12);
      uVar6 = flags[lVar7];
      for (; lVar9 != 0x20; lVar9 = lVar9 + 1) {
        uVar6 = uVar6 + (uint)*(ushort *)(auStack_4c0 + lVar9 * 2) * 0x10;
      }
      flags[lVar7] = uVar6;
    }
  }
  lVar7 = 0;
  auStack_4c0 = vmovdqu64_avx512f(auVar38);
  for (; lVar7 != 0x20; lVar7 = lVar7 + 1) {
    uVar1 = *(ushort *)(auStack_4c0 + lVar7 * 2);
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      flags[lVar9] = flags[lVar9] + (uint)((uVar1 >> ((uint)lVar9 & 0x1f) & 1) != 0);
    }
  }
  lVar7 = 0;
  auStack_4c0 = vmovdqu64_avx512f(auVar37);
  for (; lVar7 != 0x20; lVar7 = lVar7 + 1) {
    uVar1 = *(ushort *)(auStack_4c0 + lVar7 * 2);
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      flags[lVar9] = flags[lVar9] + ((uint)(uVar1 >> ((uint)lVar9 & 0x1f)) * 2 & 2);
    }
  }
  lVar7 = 0;
  auStack_4c0 = vmovdqu64_avx512f(auVar35);
  for (; lVar7 != 0x20; lVar7 = lVar7 + 1) {
    uVar1 = *(ushort *)(auStack_4c0 + lVar7 * 2);
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      flags[lVar9] = flags[lVar9] + (uVar1 >> ((uint)lVar9 & 0x1f) & 1) * 4;
    }
  }
  lVar7 = 0;
  auStack_4c0 = vmovdqu64_avx512f(auVar34);
  for (; lVar7 != 0x20; lVar7 = lVar7 + 1) {
    uVar1 = *(ushort *)(auStack_4c0 + lVar7 * 2);
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      flags[lVar9] = flags[lVar9] + (uVar1 >> ((uint)lVar9 & 0x1f) & 1) * 8;
    }
  }
  return 0x20;
}

Assistant:

int pospopcnt_u16_avx512_harvey_seal(const uint16_t* data, uint32_t len, uint32_t* flags) { 
    #if defined(__AVX512BW__) && __AVX512BW__ == 1
    return pospopcnt_u16_avx512bw_harvey_seal(data, len, flags);
    #elif defined(__AVX512VBMI__) && __AVX512VBMI__ == 1
    return pospopcnt_u16_avx512vbmi_harvey_seal(data, len, flags);
    #else
    return(0);
    #endif
}